

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O0

void verifyProcrustes<float>
               (vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *from,
               vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *to)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  double *pdVar6;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *in_RSI;
  int __x;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *in_RDI;
  Matrix44<double> *this;
  Matrix33<double> *this_00;
  float fVar7;
  float extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double dVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar9;
  double dVar10;
  V3d force;
  size_t iPoint;
  V3d netTorque;
  V3d netForce;
  int j_4;
  int i_7;
  int j_3;
  int i_6;
  double scaleDiff;
  M44d newMat;
  M44d translateMatrix;
  V3d diffTrans;
  Eulerd diffRot;
  size_t i_5;
  double delta;
  Rand48 rand;
  size_t numTries;
  double expected;
  int j_2;
  int i_4;
  M33d product;
  int j_1;
  int i_3;
  M33d upperLeft;
  float det;
  M44d ms;
  M44d m;
  size_t i_2;
  int j;
  int i_1;
  M44d m2;
  M44d m1;
  size_t i;
  vector<float,_std::allocator<float>_> weights;
  size_t n;
  float eps;
  undefined4 in_stack_fffffffffffff678;
  undefined4 in_stack_fffffffffffff67c;
  const_reference in_stack_fffffffffffff680;
  Matrix44<double> *in_stack_fffffffffffff688;
  Vec3<float> *this_01;
  allocator_type *in_stack_fffffffffffff690;
  Matrix33<double> *in_stack_fffffffffffff698;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffff6a0;
  double in_stack_fffffffffffff6a8;
  Matrix44<double> *in_stack_fffffffffffff6b0;
  M44d *in_stack_fffffffffffff710;
  size_t in_stack_fffffffffffff718;
  const_reference in_stack_fffffffffffff720;
  const_reference in_stack_fffffffffffff728;
  Vec3<float> *in_stack_fffffffffffff730;
  Euler<double> *in_stack_fffffffffffff7a8;
  undefined8 local_7b8;
  float local_764;
  Vec3<float> local_6f8;
  Vec3<float> local_6ec;
  Vec3<double> local_6e0 [2];
  Vec3<float> local_6ac;
  Vec3<double> local_6a0;
  size_type local_688;
  Vec3<double> local_680;
  Vec3<double> local_668;
  int local_650;
  int local_64c;
  int local_648;
  int local_644;
  undefined8 local_640;
  Matrix44<double> local_638 [2];
  Matrix44<double> local_538;
  Vec3<double> local_4b8 [13];
  ulong local_380;
  undefined8 local_378;
  undefined8 local_368;
  undefined8 local_360;
  int local_358;
  int local_354;
  Matrix33<double> local_308;
  int local_2c0;
  int local_2bc;
  Matrix33<double> local_2b8;
  float local_26c;
  Matrix44<double> local_268;
  Matrix44<double> local_1e8;
  ulong local_168;
  int local_160;
  int local_15c;
  Matrix44<double> local_158;
  Matrix44<double> local_d8;
  ulong local_58;
  vector<float,_std::allocator<float>_> local_38;
  size_type local_20;
  float local_14;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *local_10;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  fVar7 = std::numeric_limits<float>::epsilon();
  dVar8 = std::sqrt((double)CONCAT44(extraout_XMM0_Db,fVar7));
  local_14 = SUB84(dVar8,0);
  local_20 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::size
                       (local_8);
  std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::size(local_8);
  std::allocator<float>::allocator((allocator<float> *)0x18fda9);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffff6a0,(size_type)in_stack_fffffffffffff698,
             in_stack_fffffffffffff690);
  std::allocator<float>::~allocator((allocator<float> *)0x18fdd5);
  for (local_58 = 0; uVar1 = local_58,
      sVar2 = std::vector<float,_std::allocator<float>_>::size(&local_38), uVar1 < sVar2;
      local_58 = local_58 + 1) {
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,local_58);
    *pvVar3 = 1.0;
  }
  pvVar4 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                     (local_8,0);
  pvVar5 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                     (local_10,0);
  Imath_3_2::procrustesRotationAndTranslation<float>
            ((Vec3 *)&local_d8,(Vec3 *)pvVar4,(ulong)pvVar5,SUB81(local_20,0));
  pvVar4 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                     (local_8,0);
  pvVar5 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                     (local_10,0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,0);
  Imath_3_2::procrustesRotationAndTranslation<float>
            ((Vec3 *)&local_158,(Vec3 *)pvVar4,&pvVar5->x,(ulong)pvVar3,SUB81(local_20,0));
  for (local_15c = 0; local_15c < 4; local_15c = local_15c + 1) {
    for (local_160 = 0; local_160 < 4; local_160 = local_160 + 1) {
      Imath_3_2::Matrix44<double>::operator[](&local_d8,local_15c);
      this = &local_158;
      Imath_3_2::Matrix44<double>::operator[](this,local_15c);
      std::abs((int)this);
      if ((double)local_14 <= extraout_XMM0_Qa) {
        __assert_fail("std::abs (m1[i][j] - m2[i][j]) < eps",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                      ,0x9f,
                      "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                     );
      }
    }
  }
  for (local_168 = 0; uVar1 = local_168,
      sVar2 = std::vector<float,_std::allocator<float>_>::size(&local_38), uVar1 < sVar2;
      local_168 = local_168 + 1) {
    local_764 = (float)(local_168 + 1);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,local_168);
    *pvVar3 = local_764;
  }
  pvVar4 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                     (local_8,0);
  pvVar5 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                     (local_10,0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,0);
  Imath_3_2::procrustesRotationAndTranslation<float>
            ((Vec3 *)&local_1e8,(Vec3 *)pvVar4,&pvVar5->x,(ulong)pvVar3,SUB81(local_20,0));
  pvVar4 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                     (local_8,0);
  pvVar5 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                     (local_10,0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,0);
  Imath_3_2::procrustesRotationAndTranslation<float>
            ((Vec3 *)&local_268,(Vec3 *)pvVar4,&pvVar5->x,(ulong)pvVar3,SUB81(local_20,0));
  __x = (int)&local_1e8;
  dVar8 = Imath_3_2::Matrix44<double>::determinant(in_stack_fffffffffffff6b0);
  local_26c = (float)dVar8;
  std::abs(__x);
  if (local_14 <= extraout_XMM0_Da) {
    __assert_fail("std::abs (det - T (1)) < eps",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                  ,0xae,
                  "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                 );
  }
  Imath_3_2::Matrix33<double>::Matrix33(&local_2b8);
  for (local_2bc = 0; local_2bc < 3; local_2bc = local_2bc + 1) {
    for (local_2c0 = 0; local_2c0 < 3; local_2c0 = local_2c0 + 1) {
      pdVar6 = Imath_3_2::Matrix44<double>::operator[](&local_1e8,local_2bc);
      dVar8 = pdVar6[local_2c0];
      pdVar6 = Imath_3_2::Matrix33<double>::operator[](&local_2b8,local_2bc);
      pdVar6[local_2c0] = dVar8;
    }
  }
  Imath_3_2::Matrix33<double>::transposed((Matrix33<double> *)in_stack_fffffffffffff688);
  Imath_3_2::Matrix33<double>::operator*
            (in_stack_fffffffffffff698,(Matrix33<double> *)in_stack_fffffffffffff690);
  for (local_354 = 0; local_354 < 3; local_354 = local_354 + 1) {
    for (local_358 = 0; local_358 < 3; local_358 = local_358 + 1) {
      local_7b8 = 0x3ff0000000000000;
      if (local_354 != local_358) {
        local_7b8 = 0;
      }
      local_360 = local_7b8;
      this_00 = &local_308;
      Imath_3_2::Matrix33<double>::operator[](this_00,local_354);
      std::abs((int)this_00);
      if ((double)local_14 <= extraout_XMM0_Qa_00) {
        __assert_fail("std::abs (product[i][j] - expected) < eps",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                      ,0xbc,
                      "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                     );
      }
    }
  }
  local_368 = 10;
  Imath_3_2::Rand48::Rand48
            ((Rand48 *)in_stack_fffffffffffff680,
             CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  local_378 = 0x3f50624dd2f1a9fc;
  for (local_380 = 0; local_380 < 10; local_380 = local_380 + 1) {
    Imath_3_2::Rand48::nextf((Rand48 *)0x190560);
    Imath_3_2::Rand48::nextf((Rand48 *)0x190596);
    Imath_3_2::Rand48::nextf((Rand48 *)0x1905cc);
    Imath_3_2::Euler<double>::Euler
              ((Euler<double> *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,
               (double)in_stack_fffffffffffff6a0,(double)in_stack_fffffffffffff698,
               (Order)((ulong)in_stack_fffffffffffff690 >> 0x20),
               (InputLayout)in_stack_fffffffffffff690);
    std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
              (local_8,0);
    std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
              (local_10,0);
    std::vector<float,_std::allocator<float>_>::operator[](&local_38,0);
    Imath_3_2::Euler<double>::toMatrix44(in_stack_fffffffffffff7a8);
    Imath_3_2::Matrix44<double>::operator*
              (in_stack_fffffffffffff688,(Matrix44<double> *)in_stack_fffffffffffff680);
    dVar8 = procrustesError<float>
                      (in_stack_fffffffffffff730,in_stack_fffffffffffff728,
                       &in_stack_fffffffffffff720->x,in_stack_fffffffffffff718,
                       in_stack_fffffffffffff710);
    in_stack_fffffffffffff7a8 = (Euler<double> *)0x0;
    std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
              (local_8,0);
    std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
              (local_10,(size_type)in_stack_fffffffffffff7a8);
    std::vector<float,_std::allocator<float>_>::operator[]
              (&local_38,(size_type)in_stack_fffffffffffff7a8);
    dVar9 = procrustesError<float>
                      (in_stack_fffffffffffff730,in_stack_fffffffffffff728,
                       &in_stack_fffffffffffff720->x,in_stack_fffffffffffff718,
                       in_stack_fffffffffffff710);
    if (dVar8 <= dVar9) {
      __assert_fail("procrustesError ( &from[0], &to[0], &weights[0], n, m * diffRot.toMatrix44 ()) > procrustesError (&from[0], &to[0], &weights[0], n, m)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                    ,0xcf,
                    "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                   );
    }
    dVar8 = Imath_3_2::Rand48::nextf((Rand48 *)0x1907ce);
    dVar9 = Imath_3_2::Rand48::nextf((Rand48 *)0x190804);
    dVar10 = Imath_3_2::Rand48::nextf((Rand48 *)0x19083a);
    Imath_3_2::Vec3<double>::Vec3(local_4b8,dVar8 * 0.001,dVar9 * 0.001,dVar10 * 0.001);
    Imath_3_2::Matrix44<double>::Matrix44(&local_538);
    Imath_3_2::Matrix44<double>::translate<double>(&local_538,local_4b8);
    std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
              (local_8,0);
    std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
              (local_10,0);
    std::vector<float,_std::allocator<float>_>::operator[](&local_38,0);
    Imath_3_2::Matrix44<double>::operator*
              (in_stack_fffffffffffff688,(Matrix44<double> *)in_stack_fffffffffffff680);
    dVar8 = procrustesError<float>
                      (in_stack_fffffffffffff730,in_stack_fffffffffffff728,
                       &in_stack_fffffffffffff720->x,in_stack_fffffffffffff718,
                       in_stack_fffffffffffff710);
    in_stack_fffffffffffff718 = 0;
    in_stack_fffffffffffff720 =
         std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                   (local_8,0);
    in_stack_fffffffffffff728 =
         std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                   (local_10,in_stack_fffffffffffff718);
    std::vector<float,_std::allocator<float>_>::operator[](&local_38,in_stack_fffffffffffff718);
    in_stack_fffffffffffff730 =
         (Vec3<float> *)
         procrustesError<float>
                   (in_stack_fffffffffffff730,in_stack_fffffffffffff728,
                    &in_stack_fffffffffffff720->x,in_stack_fffffffffffff718,
                    in_stack_fffffffffffff710);
    if (dVar8 <= (double)in_stack_fffffffffffff730) {
      __assert_fail("procrustesError ( &from[0], &to[0], &weights[0], n, m * translateMatrix) > procrustesError (&from[0], &to[0], &weights[0], n, m)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                    ,0xdb,
                    "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                   );
    }
  }
  Imath_3_2::Matrix44<double>::Matrix44(local_638,&local_268);
  local_640 = 0x3f50624dd2f1a9fc;
  for (local_644 = 0; local_644 < 3; local_644 = local_644 + 1) {
    for (local_648 = 0; local_648 < 3; local_648 = local_648 + 1) {
      pdVar6 = Imath_3_2::Matrix44<double>::operator[](&local_268,local_644);
      in_stack_fffffffffffff710 = (M44d *)(pdVar6[local_648] * 1.001);
      pdVar6 = Imath_3_2::Matrix44<double>::operator[](local_638,local_644);
      pdVar6[local_648] = (double)in_stack_fffffffffffff710;
    }
  }
  std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
            (local_8,0);
  std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
            (local_10,0);
  std::vector<float,_std::allocator<float>_>::operator[](&local_38,0);
  dVar8 = procrustesError<float>
                    (in_stack_fffffffffffff730,in_stack_fffffffffffff728,
                     &in_stack_fffffffffffff720->x,in_stack_fffffffffffff718,
                     in_stack_fffffffffffff710);
  std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
            (local_8,0);
  std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
            (local_10,0);
  std::vector<float,_std::allocator<float>_>::operator[](&local_38,0);
  dVar9 = procrustesError<float>
                    (in_stack_fffffffffffff730,in_stack_fffffffffffff728,
                     &in_stack_fffffffffffff720->x,in_stack_fffffffffffff718,
                     in_stack_fffffffffffff710);
  if (dVar8 <= dVar9) {
    __assert_fail("procrustesError (&from[0], &to[0], &weights[0], n, newMat) > procrustesError (&from[0], &to[0], &weights[0], n, ms)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                  ,0xe6,
                  "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                 );
  }
  for (local_64c = 0; local_64c < 3; local_64c = local_64c + 1) {
    for (local_650 = 0; local_650 < 3; local_650 = local_650 + 1) {
      pdVar6 = Imath_3_2::Matrix44<double>::operator[](&local_268,local_64c);
      dVar8 = pdVar6[local_650];
      pdVar6 = Imath_3_2::Matrix44<double>::operator[](local_638,local_64c);
      pdVar6[local_650] = dVar8 * 0.999;
    }
  }
  sVar2 = 0;
  std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
            (local_8,0);
  std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
            (local_10,sVar2);
  std::vector<float,_std::allocator<float>_>::operator[](&local_38,sVar2);
  dVar8 = procrustesError<float>
                    (in_stack_fffffffffffff730,in_stack_fffffffffffff728,
                     &in_stack_fffffffffffff720->x,in_stack_fffffffffffff718,
                     in_stack_fffffffffffff710);
  this_01 = (Vec3<float> *)0x0;
  pvVar4 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                     (local_8,0);
  pvVar5 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                     (local_10,(size_type)this_01);
  std::vector<float,_std::allocator<float>_>::operator[](&local_38,(size_type)this_01);
  dVar9 = procrustesError<float>
                    (in_stack_fffffffffffff730,in_stack_fffffffffffff728,
                     &in_stack_fffffffffffff720->x,in_stack_fffffffffffff718,
                     in_stack_fffffffffffff710);
  if (dVar9 < dVar8) {
    Imath_3_2::Vec3<double>::Vec3(&local_668,0.0);
    Imath_3_2::Vec3<double>::Vec3(&local_680,0.0);
    for (local_688 = 0; local_688 < local_20; local_688 = local_688 + 1) {
      std::vector<float,_std::allocator<float>_>::operator[](&local_38,local_688);
      std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                (local_8,local_688);
      Imath_3_2::operator*(pvVar5,(Matrix44<double> *)pvVar4);
      std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                (local_10,local_688);
      Imath_3_2::Vec3<float>::operator-(this_01,in_stack_fffffffffffff680);
      Imath_3_2::operator*((float)((ulong)this_01 >> 0x20),in_stack_fffffffffffff680);
      Imath_3_2::Vec3<double>::Vec3<float>(&local_6a0,&local_6ac);
      Imath_3_2::Vec3<double>::operator+=(&local_668,&local_6a0);
      in_stack_fffffffffffff680 =
           std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                     (local_10,local_688);
      Imath_3_2::Vec3<float>::Vec3<double>(&local_6f8,&local_6a0);
      Imath_3_2::Vec3<float>::cross(this_01,in_stack_fffffffffffff680);
      Imath_3_2::Vec3<double>::Vec3<float>(local_6e0,&local_6ec);
      Imath_3_2::Vec3<double>::operator+=(&local_680,local_6e0);
    }
    dVar8 = Imath_3_2::Vec3<double>::length2((Vec3<double> *)0x190fa0);
    if (dVar8 < (double)local_14) {
      dVar8 = Imath_3_2::Vec3<double>::length2((Vec3<double> *)0x190fe4);
      if (dVar8 < (double)local_14) {
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)pvVar4);
        return;
      }
      __assert_fail("netTorque.length2 () < eps",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                    ,0x101,
                    "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                   );
    }
    __assert_fail("netForce.length2 () < eps",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                  ,0x100,
                  "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                 );
  }
  __assert_fail("procrustesError (&from[0], &to[0], &weights[0], n, newMat) > procrustesError (&from[0], &to[0], &weights[0], n, ms)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                ,0xed,
                "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
               );
}

Assistant:

void
verifyProcrustes (
    const std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T>>& from,
    const std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T>>& to)
{
    const T eps = std::sqrt (std::numeric_limits<T>::epsilon ());

    const size_t n = from.size ();

    // Validate that passing in uniform weights gives the same answer as
    // passing in no weights:
    std::vector<T> weights (from.size ());
    for (size_t i = 0; i < weights.size (); ++i)
        weights[i] = 1;
    IMATH_INTERNAL_NAMESPACE::M44d m1 =
        procrustesRotationAndTranslation (&from[0], &to[0], n);
    IMATH_INTERNAL_NAMESPACE::M44d m2 =
        procrustesRotationAndTranslation (&from[0], &to[0], &weights[0], n);
    for (int i = 0; i < 4; ++i)
        for (int j = 0; j < 4; ++j)
            assert (std::abs (m1[i][j] - m2[i][j]) < eps);

    // Now try the weighted version:
    for (size_t i = 0; i < weights.size (); ++i)
        weights[i] = static_cast<T>(i + 1);

    IMATH_INTERNAL_NAMESPACE::M44d m =
        procrustesRotationAndTranslation (&from[0], &to[0], &weights[0], n);

    // with scale:
    IMATH_INTERNAL_NAMESPACE::M44d ms = procrustesRotationAndTranslation (
        &from[0], &to[0], &weights[0], n, true);

    // Verify that it's orthonormal w/ positive determinant.
    const T det = static_cast<T>(m.determinant ());
    assert (std::abs (det - T (1)) < eps);

    // Verify orthonormal:
    IMATH_INTERNAL_NAMESPACE::M33d upperLeft;
    for (int i = 0; i < 3; ++i)
        for (int j = 0; j < 3; ++j)
            upperLeft[i][j] = m[i][j];
    IMATH_INTERNAL_NAMESPACE::M33d product =
        upperLeft * upperLeft.transposed ();
    for (int i = 0; i < 3; ++i)
    {
        for (int j = 0; j < 3; ++j)
        {
            const double expected = (i == j ? 1.0 : 0.0);
            assert (std::abs (product[i][j] - expected) < eps);
        }
    }

    // Verify that nearby transforms are worse:
    const size_t                     numTries = 10;
    IMATH_INTERNAL_NAMESPACE::Rand48 rand (1056);
    const double                     delta = 1e-3;
    for (size_t i = 0; i < numTries; ++i)
    {
        // Construct an orthogonal rotation matrix using Euler angles:
        IMATH_INTERNAL_NAMESPACE::Eulerd diffRot (
            delta * rand.nextf (),
            delta * rand.nextf (),
            delta * rand.nextf ());

        assert (
            procrustesError (
                &from[0], &to[0], &weights[0], n, m * diffRot.toMatrix44 ()) >
            procrustesError (&from[0], &to[0], &weights[0], n, m));

        // Try a small translation:
        IMATH_INTERNAL_NAMESPACE::V3d diffTrans (
            delta * rand.nextf (),
            delta * rand.nextf (),
            delta * rand.nextf ());
        IMATH_INTERNAL_NAMESPACE::M44d translateMatrix;
        translateMatrix.translate (diffTrans);
        assert (
            procrustesError (
                &from[0], &to[0], &weights[0], n, m * translateMatrix) >
            procrustesError (&from[0], &to[0], &weights[0], n, m));
    }

    // Try a small scale:
    IMATH_INTERNAL_NAMESPACE::M44d newMat    = ms;
    const double                   scaleDiff = delta;
    for (int i = 0; i < 3; ++i)
        for (int j = 0; j < 3; ++j)
            newMat[i][j] = ms[i][j] * (1.0 + scaleDiff);
    assert (
        procrustesError (&from[0], &to[0], &weights[0], n, newMat) >
        procrustesError (&from[0], &to[0], &weights[0], n, ms));

    for (int i = 0; i < 3; ++i)
        for (int j = 0; j < 3; ++j)
            newMat[i][j] = ms[i][j] * (1.0 - scaleDiff);
    assert (
        procrustesError (&from[0], &to[0], &weights[0], n, newMat) >
        procrustesError (&from[0], &to[0], &weights[0], n, ms));

    //
    // Verify the magical property that makes shape springs work:
    // when the displacements Q*A-B, times the weights,
    // are applied as forces at B,
    // there is zero net force and zero net torque.
    //
    {
        IMATH_INTERNAL_NAMESPACE::V3d netForce (0);
        IMATH_INTERNAL_NAMESPACE::V3d netTorque (0);
        for (size_t iPoint = 0; iPoint < n; ++iPoint)
        {
            const IMATH_INTERNAL_NAMESPACE::V3d force =
                weights[iPoint] * (from[iPoint] * m - to[iPoint]);
            netForce += force;
            netTorque += to[iPoint].cross (force);
        }

        assert (netForce.length2 () < eps);
        assert (netTorque.length2 () < eps);
    }
}